

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O2

int pk_write_ec_param(uchar **p,uchar *start,mbedtls_ecp_keypair *ec)

{
  int iVar1;
  size_t oid_len;
  char *oid;
  size_t local_20;
  char *local_18;
  
  iVar1 = mbedtls_oid_get_oid_by_ec_grp((ec->grp).id,&local_18,&local_20);
  if (iVar1 == 0) {
    iVar1 = mbedtls_asn1_write_oid(p,start,local_18,local_20);
  }
  return iVar1;
}

Assistant:

static int pk_write_ec_param( unsigned char **p, unsigned char *start,
                              mbedtls_ecp_keypair *ec )
{
    int ret;
    size_t len = 0;
    const char *oid;
    size_t oid_len;

    if( ( ret = mbedtls_oid_get_oid_by_ec_grp( ec->grp.id, &oid, &oid_len ) ) != 0 )
        return( ret );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_oid( p, start, oid, oid_len ) );

    return( (int) len );
}